

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O0

void Acb_ObjAddFaninFanoutOne(Acb_Ntk_t *p,int iObj,int iFanin)

{
  Vec_Int_t *p_00;
  int iFanin_local;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  p_00 = Vec_WecEntry(&p->vFanouts,iFanin);
  Vec_IntPush(p_00,iObj);
  Acb_ObjAddFanin(p,iObj,iFanin);
  return;
}

Assistant:

static inline void Acb_ObjAddFaninFanoutOne( Acb_Ntk_t * p, int iObj, int iFanin )
{
    Vec_IntPush( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
    Acb_ObjAddFanin( p, iObj, iFanin );
}